

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall
cfd::core::KeyData::KeyData
          (KeyData *this,ExtPrivkey *ext_privkey,string *child_path,ByteData *finterprint)

{
  ulong uVar1;
  string *in_stack_fffffffffffffe78;
  Privkey *in_stack_fffffffffffffe80;
  ByteData *this_00;
  Pubkey local_140;
  Privkey local_128;
  ExtPubkey local_108;
  Privkey local_71;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  ByteData *local_28;
  ByteData *finterprint_local;
  string *child_path_local;
  ExtPrivkey *ext_privkey_local;
  KeyData *this_local;
  
  local_28 = finterprint;
  finterprint_local = (ByteData *)child_path;
  child_path_local = (string *)ext_privkey;
  ext_privkey_local = (ExtPrivkey *)this;
  Pubkey::Pubkey(&this->pubkey_);
  Privkey::Privkey(&this->privkey_);
  ExtPrivkey::ExtPrivkey
            ((ExtPrivkey *)in_stack_fffffffffffffe80,(ExtPrivkey *)in_stack_fffffffffffffe78);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x466421);
  this_00 = &this->fingerprint_;
  ByteData::ByteData(&in_stack_fffffffffffffe80->data_,(ByteData *)in_stack_fffffffffffffe78);
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    in_stack_fffffffffffffe80 = &local_71;
    in_stack_fffffffffffffe78 = (string *)finterprint_local;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)
               ((long)&local_71.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + 1),"KeyData",
               (allocator *)in_stack_fffffffffffffe80);
    ToArrayFromString(&local_50,in_stack_fffffffffffffe78,
                      (string *)
                      ((long)&local_71.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 1),'\0');
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this->path_,&local_50);
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
    ::std::__cxx11::string::~string
              ((string *)
               ((long)&local_71.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + 1));
    ::std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  ExtPrivkey::GetExtPubkey(&local_108,(ExtPrivkey *)child_path_local);
  ExtPubkey::operator=(&this->extpubkey_,&local_108);
  ExtPubkey::~ExtPubkey((ExtPubkey *)0x466581);
  Extkey::GetPrivkey(&local_128,(Extkey *)child_path_local);
  Privkey::operator=(in_stack_fffffffffffffe80,(Privkey *)in_stack_fffffffffffffe78);
  Privkey::~Privkey((Privkey *)0x4665b8);
  Privkey::GetPubkey(&local_140,&this->privkey_);
  Pubkey::operator=(&this->pubkey_,&local_140);
  Pubkey::~Pubkey((Pubkey *)0x4665f2);
  return;
}

Assistant:

KeyData::KeyData(
    const ExtPrivkey& ext_privkey, const std::string& child_path,
    const ByteData& finterprint)
    : extprivkey_(ext_privkey), fingerprint_(finterprint) {
  if (!child_path.empty()) {
    path_ = ToArrayFromString(child_path, "KeyData", 0);
  }
  extpubkey_ = ext_privkey.GetExtPubkey();
  privkey_ = ext_privkey.GetPrivkey();
  pubkey_ = privkey_.GetPubkey();
}